

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::TextureSpecCase::verifyTex2D
          (TextureSpecCase *this,GLContext *gles2Context,ReferenceContext *refContext)

{
  ChannelOrder CVar1;
  TestLog *log;
  bool bVar2;
  uint uVar3;
  RenderTarget *pRVar4;
  ConstPixelBufferAccess *pCVar5;
  ChannelOrder CVar6;
  uint uVar7;
  ConstPixelBufferAccess *pCVar8;
  uint uVar9;
  int iVar10;
  ChannelOrder CVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  ConstPixelBufferAccess *pCVar15;
  void *pvVar16;
  int height;
  undefined1 auVar17 [16];
  Vector<bool,_4> res_1;
  Surface result;
  Surface reference;
  Vector<int,_4> res_2;
  UVec4 threshold;
  IVec4 texFormatBits;
  IVec4 accurateFmtBits;
  uint local_118;
  uint local_114;
  Surface local_110;
  Surface local_f8;
  ContextWrapper *local_e0;
  ulong local_d8;
  TextureFormat local_d0;
  undefined1 local_c8 [16];
  ReferenceContext *local_b8;
  GLContext *local_b0;
  UVec4 local_a8;
  undefined1 local_98 [16];
  ConstPixelBufferAccess local_88;
  ConstPixelBufferAccess local_58;
  
  local_118 = 1;
  if ((this->m_flags & 1) != 0) {
    uVar7 = this->m_width;
    uVar3 = 0x20;
    uVar9 = 0x20;
    if (uVar7 != 0) {
      uVar9 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> uVar9 == 0; uVar9 = uVar9 - 1) {
        }
      }
      uVar9 = uVar9 ^ 0x1f;
    }
    uVar7 = this->m_height;
    if (uVar7 != 0) {
      uVar3 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar3 = uVar3 ^ 0x1f;
    }
    iVar10 = 0x1f - uVar3;
    if ((int)(0x1f - uVar3) < (int)(0x1f - uVar9)) {
      iVar10 = 0x1f - uVar9;
    }
    local_118 = iVar10 + 1;
    if (local_118 == 0) {
      return;
    }
  }
  local_e0 = &this->super_ContextWrapper;
  local_d8 = 0;
  local_b8 = refContext;
  local_b0 = gles2Context;
  do {
    iVar13 = this->m_width >> ((byte)local_d8 & 0x1f);
    iVar10 = 1;
    if (1 < iVar13) {
      iVar10 = iVar13;
    }
    iVar14 = this->m_height >> ((byte)local_d8 & 0x1f);
    height = 1;
    if (1 < iVar14) {
      height = iVar14;
    }
    tcu::Surface::Surface(&local_f8);
    tcu::Surface::Surface(&local_110);
    if (iVar13 < 3 || iVar14 < 3) {
      tcu::Surface::~Surface(&local_110);
      tcu::Surface::~Surface(&local_f8);
    }
    else {
      sglr::ContextWrapper::setContext(local_e0,&local_b0->super_Context);
      renderTex2D(this,&local_110,iVar10,height);
      sglr::ContextWrapper::setContext(local_e0,&local_b8->super_Context);
      renderTex2D(this,&local_f8,iVar10,height);
      pRVar4 = Context::getRenderTarget((this->super_TestCase).m_context);
      local_d0 = this->m_texFormat;
      tcu::getTextureFormatBitDepth((tcu *)(local_98 + 0x10),&local_d0);
      CVar1 = (pRVar4->m_pixelFormat).redBits;
      CVar6 = CVar1;
      CVar11 = CVar1;
      if (1 < local_d0.order - L) {
        CVar6 = (pRVar4->m_pixelFormat).greenBits;
        CVar11 = (pRVar4->m_pixelFormat).blueBits;
      }
      uVar7 = (pRVar4->m_pixelFormat).alphaBits;
      uVar9 = -(uint)((int)uVar7 < local_88.m_size.m_data[1]);
      local_58.m_format.order =
           ~-(uint)((int)CVar1 < (int)local_88.m_format.order) & local_88.m_format.order |
           CVar1 & -(uint)((int)CVar1 < (int)local_88.m_format.order);
      local_58.m_format.type =
           ~-(uint)((int)CVar6 < (int)local_88.m_format.type) & local_88.m_format.type |
           CVar6 & -(uint)((int)CVar6 < (int)local_88.m_format.type);
      local_58.m_size.m_data[0] =
           ~-(uint)((int)CVar11 < local_88.m_size.m_data[0]) & local_88.m_size.m_data[0] |
           CVar11 & -(uint)((int)CVar11 < local_88.m_size.m_data[0]);
      local_58.m_size.m_data[1] = ~uVar9 & local_88.m_size.m_data[1] | uVar7 & uVar9;
      local_98._0_4_ = RGBA;
      local_98._4_4_ = UNORM_SHORT_565;
      local_98._8_4_ = 8;
      local_98._12_4_ = 8;
      auVar17._0_4_ = -(uint)(0 < (int)local_58.m_format.order);
      auVar17._4_4_ = -(uint)(0 < (int)local_58.m_format.type);
      auVar17._8_4_ = -(uint)(0 < local_58.m_size.m_data[0]);
      auVar17._12_4_ = -(uint)(0 < local_58.m_size.m_data[1]);
      auVar17 = packssdw(auVar17,auVar17);
      auVar17 = packsswb(auVar17,auVar17);
      local_114 = auVar17._0_4_ & (uint)DAT_01b805f0;
      local_c8 = (undefined1  [16])0x0;
      pCVar8 = (ConstPixelBufferAccess *)local_98;
      lVar12 = 0;
      pCVar5 = &local_58;
      do {
        pCVar15 = pCVar8;
        if (*(char *)((long)&local_114 + lVar12) != '\0') {
          pCVar15 = pCVar5;
        }
        *(ChannelOrder *)(local_c8 + lVar12 * 4) = (pCVar15->m_format).order;
        lVar12 = lVar12 + 1;
        pCVar8 = (ConstPixelBufferAccess *)&(pCVar8->m_format).type;
        pCVar5 = (ConstPixelBufferAccess *)&(pCVar5->m_format).type;
      } while (lVar12 != 4);
      local_a8.m_data[0] = (uint)(float)((9 - local_c8._0_4_) * 0x800000 + 0x3f800000);
      local_a8.m_data[1] = (uint)(float)((9 - local_c8._4_4_) * 0x800000 + 0x3f800000);
      local_a8.m_data[2] = (uint)(float)((9 - local_c8._8_4_) * 0x800000 + 0x3f800000);
      local_a8.m_data[3] = (uint)(float)((9 - local_c8._12_4_) * 0x800000 + 0x3f800000);
      log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      local_58.m_format.order = RGBA;
      local_58.m_format.type = UNORM_INT8;
      pvVar16 = (void *)local_f8.m_pixels.m_cap;
      if ((void *)local_f8.m_pixels.m_cap != (void *)0x0) {
        pvVar16 = local_f8.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)(local_98 + 0x10),&local_58.m_format,local_f8.m_width,
                 local_f8.m_height,1,pvVar16);
      local_c8._0_8_ = 0x300000008;
      pvVar16 = (void *)local_110.m_pixels.m_cap;
      if ((void *)local_110.m_pixels.m_cap != (void *)0x0) {
        pvVar16 = local_110.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&local_58,(TextureFormat *)local_c8,local_110.m_width,
                 local_110.m_height,1,pvVar16);
      bVar2 = tcu::intThresholdCompare
                        (log,"Result","Image comparison result",
                         (ConstPixelBufferAccess *)(local_98 + 0x10),&local_58,&local_a8,
                         COMPARE_LOG_ON_ERROR - ((int)local_d8 == 0));
      if (!bVar2) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Image comparison failed");
        tcu::Surface::~Surface(&local_110);
        tcu::Surface::~Surface(&local_f8);
        return;
      }
      tcu::Surface::~Surface(&local_110);
      tcu::Surface::~Surface(&local_f8);
    }
    uVar7 = (int)local_d8 + 1;
    local_d8 = (ulong)uVar7;
    if (uVar7 == local_118) {
      return;
    }
  } while( true );
}

Assistant:

void TextureSpecCase::verifyTex2D (sglr::GLContext& gles2Context, sglr::ReferenceContext& refContext)
{
	int numLevels = (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;

	DE_ASSERT(m_texType == TEXTURETYPE_2D);

	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		int				levelW		= de::max(1, m_width >> levelNdx);
		int				levelH		= de::max(1, m_height >> levelNdx);
		tcu::Surface	reference;
		tcu::Surface	result;

		if (levelW <= 2 || levelH <= 2)
			continue; // Don't bother checking.

		// Render with GLES2
		setContext(&gles2Context);
		renderTex2D(result, levelW, levelH);

		// Render reference.
		setContext(&refContext);
		renderTex2D(reference, levelW, levelH);

		{
			tcu::UVec4	threshold	= computeCompareThreshold(m_context.getRenderTarget().getPixelFormat(), m_texFormat);
			bool		isOk		= tcu::intThresholdCompare(m_testCtx.getLog(), "Result", "Image comparison result", reference.getAccess(), result.getAccess(), threshold,
															   levelNdx == 0 ? tcu::COMPARE_LOG_RESULT : tcu::COMPARE_LOG_ON_ERROR);

			if (!isOk)
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
				break;
			}
		}
	}
}